

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# euler.c
# Opt level: O0

void glmc_euler_yxz_quat(float *angles,float *dest)

{
  float *in_RSI;
  float *in_RDI;
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float zs;
  float ys;
  float xs;
  float zc;
  float yc;
  float xc;
  
  fVar1 = sinf(*in_RDI * 0.5);
  fVar2 = cosf(*in_RDI * 0.5);
  fVar3 = sinf(in_RDI[1] * 0.5);
  fVar4 = cosf(in_RDI[1] * 0.5);
  fVar5 = sinf(in_RDI[2] * 0.5);
  fVar6 = cosf(in_RDI[2] * 0.5);
  *in_RSI = fVar4 * fVar1 * fVar6 + fVar3 * fVar2 * fVar5;
  in_RSI[1] = -fVar4 * fVar1 * fVar5 + fVar3 * fVar2 * fVar6;
  in_RSI[2] = fVar4 * fVar2 * fVar5 + -(fVar3 * fVar1 * fVar6);
  in_RSI[3] = fVar4 * fVar2 * fVar6 + fVar3 * fVar1 * fVar5;
  return;
}

Assistant:

CGLM_EXPORT
void
glmc_euler_yxz_quat(vec3 angles, versor dest) {
  glm_euler_yxz_quat(angles, dest);
}